

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void NuttallWindow(int y_length,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int local_24;
  int i;
  double tmp;
  double *y_local;
  int y_length_local;
  
  for (local_24 = 0; local_24 < y_length; local_24 = local_24 + 1) {
    dVar1 = (double)local_24 / ((double)y_length - 1.0);
    dVar2 = cos(dVar1 * 6.283185307179586);
    dVar3 = cos(dVar1 * 12.566370614359172);
    dVar1 = cos(dVar1 * 18.84955592153876);
    y[local_24] = dVar1 * -0.012604 + dVar3 * 0.144232 + dVar2 * -0.487396 + 0.355768;
  }
  return;
}

Assistant:

void NuttallWindow(int y_length, double *y) {
  double tmp;
  for (int i = 0; i < y_length; ++i) {
    tmp  = i / (y_length - 1.0);
    y[i] = 0.355768 - 0.487396 * cos(2.0 * world::kPi * tmp) +
      0.144232 * cos(4.0 * world::kPi * tmp) -
      0.012604 * cos(6.0 * world::kPi * tmp);
  }
}